

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

int mapIsland(Layer *l,int *out,int x,int z,int w,int h)

{
  uint64_t ss;
  int iVar1;
  long lVar2;
  uint64_t uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  long lVar8;
  int *piVar9;
  int *piVar10;
  
  uVar4 = (ulong)(uint)h;
  iVar1 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar1 == 0) {
    lVar2 = (long)w;
    lVar8 = 0;
    if (0 < lVar2) {
      lVar8 = lVar2;
    }
    if (h < 1) {
      uVar4 = 0;
    }
    ss = l->startSeed;
    piVar9 = out + lVar2 + 4;
    piVar7 = out + lVar2 * 2 + 5;
    uVar6 = 0;
    piVar10 = out;
    while (uVar6 != uVar4) {
      for (lVar5 = 0; lVar8 != lVar5; lVar5 = lVar5 + 1) {
        iVar1 = piVar9[lVar5 + -1];
        piVar10[lVar5] = iVar1;
        if ((((iVar1 == 0) && (out[lVar5 + 1] == 0)) && (piVar9[lVar5] == 0)) &&
           ((piVar9[lVar5 + -2] == 0 && (piVar7[lVar5] == 0)))) {
          uVar3 = getChunkSeed(ss,x + (int)lVar5,(int)uVar6 + z);
          if (((uint)uVar3 >> 0x18 & 1) == 0) {
            piVar10[lVar5] = 1;
          }
        }
      }
      piVar9 = piVar9 + lVar2 + 2;
      piVar10 = piVar10 + lVar2;
      piVar7 = piVar7 + lVar2 + 2;
      out = out + lVar2 + 2;
      uVar6 = uVar6 + 1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mapIsland(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v11 = out[i+1 + (j+1)*pW];
            out[i + j*w] = v11;

            if (v11 == Oceanic)
            {
                if (out[i+1 + (j+0)*pW] != Oceanic) continue;
                if (out[i+2 + (j+1)*pW] != Oceanic) continue;
                if (out[i+0 + (j+1)*pW] != Oceanic) continue;
                if (out[i+1 + (j+2)*pW] != Oceanic) continue;

                cs = getChunkSeed(ss, i+x, j+z);
                if (mcFirstIsZero(cs, 2))
                {
                    out[i + j*w] = 1;
                }
            }
        }
    }

    return 0;
}